

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O0

void __thiscall Js::DebugContext::DebugContext(DebugContext *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext_local;
  DebugContext *this_local;
  
  this->scriptContext = scriptContext;
  this->hostDebugContext = (HostDebugContext *)0x0;
  this->diagProbesContainer = (ProbeContainer *)0x0;
  this->debuggerMode = NotDebugging;
  this->field_0x1c = this->field_0x1c & 0xfe;
  this->field_0x1c = this->field_0x1c & 0xfd;
  this->field_0x1c = this->field_0x1c & 0xfb | 4;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                ,0x13,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

DebugContext::DebugContext(Js::ScriptContext * scriptContext) :
        scriptContext(scriptContext),
        hostDebugContext(nullptr),
        diagProbesContainer(nullptr),
        isClosed(false),
        debuggerMode(DebuggerMode::NotDebugging),
        isReparsingSource(false),
        isDebuggerRecording(true)
    {
        Assert(scriptContext != nullptr);
    }